

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundPositivePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  short sVar1;
  UnifiedVectorFormat *pUVar2;
  short *psVar3;
  short *psVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  byte bVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  const_reference this_00;
  pointer pEVar14;
  reference vector;
  UnifiedVectorFormat *pUVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  short sVar18;
  short sVar19;
  ulong uVar20;
  VectorType VVar21;
  ulong uVar22;
  UnifiedVectorFormat *pUVar23;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar24;
  short sVar25;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  long local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)(pBVar12 + 0x198));
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(pBVar12 + 0x180),0);
  pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  bVar11 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar14 + 0x38));
  sVar1 = *(short *)(&NumericHelper::POWERS_OF_TEN + ((ulong)bVar11 - (long)*(int *)(pFVar13 + 8)));
  sVar25 = (short)((uint)(int)(short)(sVar1 - (sVar1 >> 0xf)) >> 1);
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  pUVar2 = *(UnifiedVectorFormat **)(input + 0x18);
  VVar21 = (VectorType)result;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar21);
    lVar7 = *(long *)(result + 0x20);
    lVar8 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if (*(long *)(vector + 0x28) == 0) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        pUVar24 = (UnifiedVectorFormat *)0x0;
        do {
          sVar18 = *(short *)(lVar8 + (long)pUVar24 * 2);
          sVar19 = sVar25;
          if (sVar18 < 0) {
            sVar19 = -sVar25;
          }
          *(short *)(lVar7 + (long)pUVar24 * 2) = (short)(sVar19 + sVar18) / sVar1;
          pUVar24 = pUVar24 + 1;
        } while (pUVar2 != pUVar24);
      }
    }
    else {
      *(long *)(result + 0x28) = *(long *)(vector + 0x28);
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(vector + 0x30));
      *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
      if ((UnifiedVectorFormat *)0x3f < pUVar2 + 0x3f) {
        lVar5 = *(long *)(vector + 0x28);
        uVar22 = 0;
        pUVar24 = (UnifiedVectorFormat *)0x0;
        do {
          if (lVar5 == 0) {
            pUVar15 = pUVar24 + 0x40;
            if (pUVar2 <= pUVar24 + 0x40) {
              pUVar15 = pUVar2;
            }
LAB_006bcb71:
            pUVar23 = pUVar24;
            if (pUVar24 < pUVar15) {
              do {
                sVar18 = *(short *)(lVar8 + (long)pUVar24 * 2);
                sVar19 = sVar25;
                if (sVar18 < 0) {
                  sVar19 = -sVar25;
                }
                *(short *)(lVar7 + (long)pUVar24 * 2) = (short)(sVar19 + sVar18) / sVar1;
                pUVar24 = pUVar24 + 1;
                pUVar23 = pUVar15;
              } while (pUVar15 != pUVar24);
            }
          }
          else {
            uVar6 = *(ulong *)(lVar5 + uVar22 * 8);
            pUVar15 = pUVar24 + 0x40;
            if (pUVar2 <= pUVar24 + 0x40) {
              pUVar15 = pUVar2;
            }
            pUVar23 = pUVar15;
            if (uVar6 != 0) {
              if (uVar6 == 0xffffffffffffffff) goto LAB_006bcb71;
              pUVar23 = pUVar24;
              if (pUVar24 < pUVar15) {
                uVar20 = 0;
                do {
                  if ((uVar6 >> (uVar20 & 0x3f) & 1) != 0) {
                    sVar18 = *(short *)((long)pUVar24 * 2 + lVar8 + uVar20 * 2);
                    sVar19 = sVar25;
                    if (sVar18 < 0) {
                      sVar19 = -sVar25;
                    }
                    *(short *)(lVar7 + (long)pUVar24 * 2 + uVar20 * 2) =
                         (short)(sVar19 + sVar18) / sVar1;
                  }
                  uVar20 = uVar20 + 1;
                  pUVar23 = pUVar15;
                } while ((long)pUVar15 - (long)pUVar24 != uVar20);
              }
            }
          }
          uVar22 = uVar22 + 1;
          pUVar24 = pUVar23;
        } while (uVar22 != (ulong)(pUVar2 + 0x3f) >> 6);
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar21);
    psVar3 = *(short **)(result + 0x20);
    psVar4 = *(short **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) != (byte *)0x0) && ((**(byte **)(vector + 0x28) & 1) == 0)) {
      duckdb::ConstantVector::SetNull(result,true);
      return;
    }
    duckdb::ConstantVector::SetNull(result,false);
    sVar18 = -sVar25;
    if (-1 < *psVar4) {
      sVar18 = sVar25;
    }
    *psVar3 = (short)(sVar18 + *psVar4) / sVar1;
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar2);
    duckdb::Vector::SetVectorType(VVar21);
    lVar7 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        lVar8 = *local_78;
        pUVar24 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar15 = pUVar24;
          if (lVar8 != 0) {
            pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar24 * 4);
          }
          sVar18 = *(short *)(local_70 + (long)pUVar15 * 2);
          sVar19 = sVar25;
          if (sVar18 < 0) {
            sVar19 = -sVar25;
          }
          *(short *)(lVar7 + (long)pUVar24 * 2) = (short)(sVar19 + sVar18) / sVar1;
          pUVar24 = pUVar24 + 1;
        } while (pUVar2 != pUVar24);
      }
    }
    else if (pUVar2 != (UnifiedVectorFormat *)0x0) {
      lVar8 = *local_78;
      pUVar24 = (UnifiedVectorFormat *)0x0;
      local_88 = local_70;
      do {
        pUVar15 = pUVar24;
        if (lVar8 != 0) {
          pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar24 * 4);
        }
        if ((*(ulong *)(local_68 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1) == 0)
        {
          _Var17._M_head_impl = *(unsigned_long **)(result + 0x28);
          if (_Var17._M_head_impl == (unsigned_long *)0x0) {
            local_80 = *(unsigned_long *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var10 = p_Stack_90;
            uVar9 = local_98;
            local_98 = 0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = uVar9;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            _Var17._M_head_impl =
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)(result + 0x28) = _Var17._M_head_impl;
            local_70 = local_88;
          }
          bVar11 = (byte)pUVar24 & 0x3f;
          _Var17._M_head_impl[(ulong)pUVar24 >> 6] =
               _Var17._M_head_impl[(ulong)pUVar24 >> 6] &
               (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        else {
          sVar18 = *(short *)(local_70 + (long)pUVar15 * 2);
          sVar19 = sVar25;
          if (sVar18 < 0) {
            sVar19 = -sVar25;
          }
          *(short *)(lVar7 + (long)pUVar24 * 2) = (short)(sVar19 + sVar18) / sVar1;
        }
        pUVar24 = pUVar24 + 1;
      } while (pUVar2 != pUVar24);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}